

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsOutput::cleanup(QKmsOutput *this,EVP_PKEY_CTX *ctx)

{
  QKmsOutput *unaff_retaddr;
  QKmsOutput *device;
  
  device = this;
  if (this->dpms_prop != (drmModePropertyPtr)0x0) {
    drmModeFreeProperty(this->dpms_prop);
    this->dpms_prop = (drmModePropertyPtr)0x0;
  }
  if (this->edid_blob != (drmModePropertyBlobPtr)0x0) {
    drmModeFreePropertyBlob(this->edid_blob);
    this->edid_blob = (drmModePropertyBlobPtr)0x0;
  }
  restoreMode(unaff_retaddr,(QKmsDevice *)device);
  if (this->saved_crtc != (drmModeCrtcPtr)0x0) {
    drmModeFreeCrtc(this->saved_crtc);
    this->saved_crtc = (drmModeCrtcPtr)0x0;
  }
  return;
}

Assistant:

void QKmsOutput::cleanup(QKmsDevice *device)
{
    if (dpms_prop) {
        drmModeFreeProperty(dpms_prop);
        dpms_prop = nullptr;
    }

    if (edid_blob) {
        drmModeFreePropertyBlob(edid_blob);
        edid_blob = nullptr;
    }

    restoreMode(device);

    if (saved_crtc) {
        drmModeFreeCrtc(saved_crtc);
        saved_crtc = nullptr;
    }
}